

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O2

void __thiscall Args::Command::checkCorrectnessAfterParsing(Command *this)

{
  int iVar1;
  BaseException *this_00;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[6])();
  if ((char)iVar1 != '\0') {
    GroupIface::checkCorrectnessAfterParsing(&this->super_GroupIface);
  }
  iVar1 = (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[6])(this);
  if ((((char)iVar1 != '\0') && (this->m_isSubCommandRequired == true)) &&
     (this->m_subCommand == (Command *)0x0)) {
    this_00 = (BaseException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_78,"Wasn\'t defined required sub-command of command \"",&local_99);
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_98,this);
    std::operator+(&local_58,&local_78,&local_98);
    std::operator+(&local_38,&local_58,"\".");
    BaseException::BaseException(this_00,&local_38);
    __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
  }
  return;
}

Assistant:

void checkCorrectnessAfterParsing() const override
	{
		if( isDefined() )
			GroupIface::checkCorrectnessAfterParsing();

		if( isDefined() && m_isSubCommandRequired && !m_subCommand )
			throw BaseException( String( SL( "Wasn't defined required sub-command of command \"" ) ) +
				name() + SL( "\"." ) );
	}